

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyInstance.cpp
# Opt level: O0

void Js::WebAssemblyInstance::InitialGlobals
               (WebAssemblyModule *wasmModule,ScriptContext *ctx,WebAssemblyEnvironment *env)

{
  uint32 uVar1;
  Type TVar2;
  uint32 index;
  WasmType WVar3;
  WasmType WVar4;
  WasmGlobal *this;
  WasmGlobal *this_00;
  WasmConstLitNode WVar5;
  WasmGlobal *local_68;
  int64 local_60;
  WasmGlobal *local_58;
  int64 local_50;
  WasmGlobal *sourceGlobal;
  WasmConstLitNode cnst;
  WasmGlobal *global;
  uint i;
  uint count;
  WebAssemblyEnvironment *env_local;
  ScriptContext *ctx_local;
  WebAssemblyModule *wasmModule_local;
  
  uVar1 = WebAssemblyModule::GetGlobalCount(wasmModule);
  global._0_4_ = 0;
  do {
    if (uVar1 <= (uint)global) {
      return;
    }
    this = WebAssemblyModule::GetGlobal(wasmModule,(uint)global);
    TVar2 = Wasm::WasmGlobal::GetReferenceType(this);
    if (TVar2 != ImportedReference) {
      TVar2 = Wasm::WasmGlobal::GetReferenceType(this);
      if (TVar2 == LocalReference) {
        index = Wasm::WasmGlobal::GetGlobalIndexInit(this);
        this_00 = WebAssemblyModule::GetGlobal(wasmModule,index);
        TVar2 = Wasm::WasmGlobal::GetReferenceType(this_00);
        if ((TVar2 != Const) &&
           (TVar2 = Wasm::WasmGlobal::GetReferenceType(this_00), TVar2 != ImportedReference)) {
          JavascriptError::ThrowTypeError(ctx,-0x7ff5e4a1,(PCWSTR)0x0);
        }
        WVar3 = Wasm::WasmGlobal::GetType(this_00);
        WVar4 = Wasm::WasmGlobal::GetType(this);
        if (WVar3 != WVar4) {
          JavascriptError::ThrowTypeError(ctx,-0x7ff5e49f,(PCWSTR)0x0);
        }
        WVar5 = WebAssemblyEnvironment::GetGlobalValue(env,this_00);
        local_58 = (WasmGlobal *)WVar5.field_0.f64;
        sourceGlobal = local_58;
        local_50 = WVar5.field_0._8_8_;
        cnst.field_0.i64 = local_50;
      }
      else {
        WVar5 = Wasm::WasmGlobal::GetConstInit(this);
        local_68 = (WasmGlobal *)WVar5.field_0.f64;
        sourceGlobal = local_68;
        local_60 = WVar5.field_0._8_8_;
        cnst.field_0.i64 = local_60;
      }
      WVar5.field_0._8_8_ = cnst.field_0.i64;
      WVar5.field_0.f64 = (double)sourceGlobal;
      WebAssemblyEnvironment::SetGlobalValue(env,this,WVar5);
    }
    global._0_4_ = (uint)global + 1;
  } while( true );
}

Assistant:

void WebAssemblyInstance::InitialGlobals(WebAssemblyModule * wasmModule, ScriptContext* ctx, WebAssemblyEnvironment* env)
{
    uint count = wasmModule->GetGlobalCount();
    for (uint i = 0; i < count; i++)
    {
        Wasm::WasmGlobal* global = wasmModule->GetGlobal(i);
        Wasm::WasmConstLitNode cnst = {};

        if (global->GetReferenceType() == Wasm::GlobalReferenceTypes::ImportedReference)
        {
            // the value should already be resolved
            continue;
        }

        if (global->GetReferenceType() == Wasm::GlobalReferenceTypes::LocalReference)
        {
            Wasm::WasmGlobal* sourceGlobal = wasmModule->GetGlobal(global->GetGlobalIndexInit());
            if (sourceGlobal->GetReferenceType() != Wasm::GlobalReferenceTypes::Const &&
                sourceGlobal->GetReferenceType() != Wasm::GlobalReferenceTypes::ImportedReference)
            {
                JavascriptError::ThrowTypeError(ctx, WASMERR_InvalidGlobalRef);
            }

            if (sourceGlobal->GetType() != global->GetType())
            {
                JavascriptError::ThrowTypeError(ctx, WASMERR_InvalidTypeConversion);
            }
            cnst = env->GetGlobalValue(sourceGlobal);
        }
        else
        {
            cnst = global->GetConstInit();
        }

        env->SetGlobalValue(global, cnst);
    }
}